

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

bool __thiscall bench::push_back_solver(bench *this,string_view name)

{
  bool bVar1;
  char *in_RCX;
  string_view name_00;
  optional<bench::solver> slv;
  undefined1 local_40 [32];
  bool local_20;
  
  name_00._M_len = name._M_str;
  name_00._M_str = in_RCX;
  solver::make_solver((optional<bench::solver> *)local_40,(solver *)name._M_len,name_00);
  bVar1 = local_20;
  if (local_20 == true) {
    std::vector<bench::solver,std::allocator<bench::solver>>::emplace_back<bench::solver&>
              ((vector<bench::solver,std::allocator<bench::solver>> *)&this->solvers,
               (solver *)local_40);
  }
  if ((local_20 & 1U) != 0) {
    local_20 = false;
    if ((undefined1 *)local_40._0_8_ != local_40 + 0x10) {
      operator_delete((void *)local_40._0_8_,local_40._16_8_ + 1);
    }
  }
  return bVar1;
}

Assistant:

bool push_back_solver(std::string_view name)
    {
        auto slv = solver::make_solver(name);
        if (!slv)
            return false;

        solvers.emplace_back(*slv);

        return true;
    }